

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,false,true>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  SVOBitset *other;
  Proof *this_00;
  element_type *peVar1;
  BitWord BVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  SVOBitset *pSVar9;
  undefined8 uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint g;
  HomomorphismModel *this_01;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  SVOBitset check_d_values;
  conditional_t<true,_SVOBitset,_tuple<>_> before;
  NamedVertex local_198;
  NamedVertex local_170;
  undefined1 local_148 [128];
  uint local_c8;
  element_type *local_c0;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  
  bVar5 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  local_38 = 0;
  other = &d->values;
  SVOBitset::operator=((SVOBitset *)&local_b8,other);
  if ((bVar5 & 1) != 0) {
    pSVar9 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(other,pSVar9);
  }
  bVar6 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar6 & 1) != 0) {
    pSVar9 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(other,pSVar9);
  }
  uVar14 = (ulong)local_38;
  uVar10 = &local_b8;
  if (0x10 < uVar14) {
    uVar10 = local_b8.short_data[0];
  }
  if (uVar14 == 0) {
    iVar7 = 0;
  }
  else {
    auVar31 = vpbroadcastq_avx512f();
    uVar11 = 0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar34 = auVar33;
      auVar33 = vpbroadcastq_avx512f();
      auVar33 = vporq_avx512f(auVar33,auVar32);
      uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
      auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar10 + uVar11 * 8));
      auVar39._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
      auVar39._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
      auVar39._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
      auVar39._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
      auVar39._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
      auVar39._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
      auVar39._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
      auVar39._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
      auVar33 = vpopcntq_avx512_vpopcntdq(auVar39);
      auVar23 = vpmovqd_avx512f(auVar33);
      auVar23 = vpaddd_avx2(auVar34._0_32_,auVar23);
      uVar11 = uVar11 + 8;
      auVar33 = ZEXT3264(auVar23);
    } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
    auVar23 = vmovdqa32_avx512vl(auVar23);
    bVar3 = (bool)((byte)uVar4 & 1);
    auVar15._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar34._0_4_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar34._4_4_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar34._8_4_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar34._12_4_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar24._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar34._16_4_;
    auVar24._0_16_ = auVar15;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar24._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar34._20_4_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar24._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar34._24_4_;
    bVar3 = SUB81(uVar4 >> 7,0);
    auVar24._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar34._28_4_;
    auVar15 = vphaddd_avx(auVar24._16_16_,auVar15);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    iVar7 = auVar15._0_4_;
  }
  uVar14 = (ulong)(d->values).n_words;
  pSVar9 = other;
  if (0x10 < uVar14) {
    pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
  }
  if (uVar14 == 0) {
    iVar8 = 0;
  }
  else {
    auVar31 = vpbroadcastq_avx512f();
    uVar11 = 0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar39 = auVar33;
      auVar33 = vpbroadcastq_avx512f();
      auVar33 = vporq_avx512f(auVar33,auVar32);
      uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
      auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar9->_data + uVar11 * 8));
      auVar34._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
      auVar34._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
      auVar34._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
      auVar34._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
      auVar34._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
      auVar34._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
      auVar34._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
      auVar34._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
      auVar33 = vpopcntq_avx512_vpopcntdq(auVar34);
      auVar23 = vpmovqd_avx512f(auVar33);
      auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
      uVar11 = uVar11 + 8;
      auVar33 = ZEXT3264(auVar23);
    } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
    auVar24 = vmovdqa32_avx512vl(auVar23);
    bVar3 = (bool)((byte)uVar4 & 1);
    auVar16._0_4_ = (uint)bVar3 * auVar24._0_4_ | (uint)!bVar3 * auVar39._0_4_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar3 * auVar24._4_4_ | (uint)!bVar3 * auVar39._4_4_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar3 * auVar24._8_4_ | (uint)!bVar3 * auVar39._8_4_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar3 * auVar24._12_4_ | (uint)!bVar3 * auVar39._12_4_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar3 * auVar24._16_4_ | (uint)!bVar3 * auVar39._16_4_;
    auVar23._0_16_ = auVar16;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar3 * auVar24._20_4_ | (uint)!bVar3 * auVar39._20_4_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar3 * auVar24._24_4_ | (uint)!bVar3 * auVar39._24_4_;
    bVar3 = SUB81(uVar4 >> 7,0);
    auVar23._28_4_ = (uint)bVar3 * auVar24._28_4_ | (uint)!bVar3 * auVar39._28_4_;
    auVar15 = vphaddd_avx(auVar23._16_16_,auVar16);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    iVar8 = auVar15._0_4_;
  }
  if (iVar7 != iVar8) {
    this_00 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)local_148,this->model,current_assignment->pattern_vertex);
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              (&local_198,this->model,current_assignment->target_vertex);
    uVar14 = (ulong)local_38;
    uVar10 = local_b8.long_data;
    if (uVar14 < 0x11) {
      uVar10 = &local_b8;
    }
    if (uVar14 == 0) {
      iVar7 = 0;
    }
    else {
      auVar31 = vpbroadcastq_avx512f();
      uVar11 = 0;
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar39 = auVar33;
        auVar33 = vpbroadcastq_avx512f();
        auVar33 = vporq_avx512f(auVar33,auVar32);
        uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
        auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar10 + uVar11 * 8));
        auVar35._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
        auVar35._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
        auVar35._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
        auVar35._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
        auVar35._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
        auVar35._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
        auVar35._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
        auVar35._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
        auVar33 = vpopcntq_avx512_vpopcntdq(auVar35);
        auVar23 = vpmovqd_avx512f(auVar33);
        auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
        uVar11 = uVar11 + 8;
        auVar33 = ZEXT3264(auVar23);
      } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
      auVar23 = vmovdqa32_avx512vl(auVar23);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar17._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar39._0_4_;
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar17._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar39._4_4_;
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar17._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar39._8_4_;
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar17._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar39._12_4_;
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar25._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar39._16_4_;
      auVar25._0_16_ = auVar17;
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar25._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar39._20_4_;
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar25._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar39._24_4_;
      bVar3 = SUB81(uVar4 >> 7,0);
      auVar25._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar39._28_4_;
      auVar15 = vphaddd_avx(auVar25._16_16_,auVar17);
      auVar15 = vphaddd_avx(auVar15,auVar15);
      auVar15 = vphaddd_avx(auVar15,auVar15);
      iVar7 = auVar15._0_4_;
    }
    uVar14 = (ulong)(d->values).n_words;
    pSVar9 = other;
    if (0x10 < uVar14) {
      pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
    }
    if (uVar14 == 0) {
      iVar8 = 0;
    }
    else {
      auVar31 = vpbroadcastq_avx512f();
      uVar11 = 0;
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar39 = auVar33;
        auVar33 = vpbroadcastq_avx512f();
        auVar33 = vporq_avx512f(auVar33,auVar32);
        uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
        auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar9->_data + uVar11 * 8));
        auVar36._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
        auVar36._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
        auVar36._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
        auVar36._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
        auVar36._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
        auVar36._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
        auVar36._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
        auVar36._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
        auVar33 = vpopcntq_avx512_vpopcntdq(auVar36);
        auVar23 = vpmovqd_avx512f(auVar33);
        auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
        uVar11 = uVar11 + 8;
        auVar33 = ZEXT3264(auVar23);
      } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
      auVar23 = vmovdqa32_avx512vl(auVar23);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar18._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar39._0_4_;
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar39._4_4_;
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar39._8_4_;
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar39._12_4_;
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar39._16_4_;
      auVar26._0_16_ = auVar18;
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar39._20_4_;
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar39._24_4_;
      bVar3 = SUB81(uVar4 >> 7,0);
      auVar26._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar39._28_4_;
      auVar15 = vphaddd_avx(auVar26._16_16_,auVar18);
      auVar15 = vphaddd_avx(auVar15,auVar15);
      auVar15 = vphaddd_avx(auVar15,auVar15);
      iVar8 = auVar15._0_4_;
    }
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(&local_170,this->model,d->v);
    Proof::propagated(this_00,(NamedVertex *)local_148,&local_198,0,iVar7 - iVar8,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.second._M_dataplus._M_p != &local_170.second.field_2) {
      operator_delete(local_170.second._M_dataplus._M_p,
                      local_170.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.second._M_dataplus._M_p != &local_198.second.field_2) {
      operator_delete(local_198.second._M_dataplus._M_p,
                      local_198.second.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_148._8_8_ != local_148 + 0x18) {
      operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
    }
  }
  SVOBitset::operator=((SVOBitset *)&local_b8,other);
  this_01 = this->model;
  if (1 < this_01->max_graphs) {
    g = 1;
    do {
      if ((bVar5 >> (g & 0x1f) & 1) != 0) {
        pSVar9 = HomomorphismModel::target_graph_row(this_01,g,current_assignment->target_vertex);
        SVOBitset::operator&=(other,pSVar9);
      }
      uVar14 = (ulong)local_38;
      uVar10 = &local_b8;
      if (0x10 < uVar14) {
        uVar10 = local_b8.long_data;
      }
      if (uVar14 == 0) {
        iVar7 = 0;
      }
      else {
        auVar31 = vpbroadcastq_avx512f();
        uVar11 = 0;
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar39 = auVar33;
          auVar33 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar33,auVar32);
          uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
          auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar10 + uVar11 * 8));
          auVar37._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
          auVar37._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
          auVar37._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
          auVar37._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
          auVar37._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
          auVar37._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
          auVar37._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
          auVar37._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
          auVar33 = vpopcntq_avx512_vpopcntdq(auVar37);
          auVar23 = vpmovqd_avx512f(auVar33);
          auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
          uVar11 = uVar11 + 8;
          auVar33 = ZEXT3264(auVar23);
        } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
        auVar23 = vmovdqa32_avx512vl(auVar23);
        bVar3 = (bool)((byte)uVar4 & 1);
        auVar19._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar39._0_4_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar19._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar39._4_4_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar19._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar39._8_4_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar19._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar39._12_4_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar39._16_4_;
        auVar27._0_16_ = auVar19;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar39._20_4_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar39._24_4_;
        bVar3 = SUB81(uVar4 >> 7,0);
        auVar27._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar39._28_4_;
        auVar15 = vphaddd_avx(auVar27._16_16_,auVar19);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        iVar7 = auVar15._0_4_;
      }
      uVar14 = (ulong)(d->values).n_words;
      pSVar9 = other;
      if (0x10 < uVar14) {
        pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
      }
      if (uVar14 == 0) {
        iVar8 = 0;
      }
      else {
        auVar31 = vpbroadcastq_avx512f();
        uVar11 = 0;
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar39 = auVar33;
          auVar33 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar33,auVar32);
          uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
          auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar9->_data + uVar11 * 8));
          auVar38._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
          auVar38._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
          auVar38._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
          auVar38._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
          auVar38._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
          auVar38._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
          auVar38._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
          auVar38._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
          auVar33 = vpopcntq_avx512_vpopcntdq(auVar38);
          auVar23 = vpmovqd_avx512f(auVar33);
          auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
          uVar11 = uVar11 + 8;
          auVar33 = ZEXT3264(auVar23);
        } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
        auVar23 = vmovdqa32_avx512vl(auVar23);
        bVar3 = (bool)((byte)uVar4 & 1);
        auVar20._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar39._0_4_;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar20._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar39._4_4_;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar20._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar39._8_4_;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar20._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar39._12_4_;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar39._16_4_;
        auVar28._0_16_ = auVar20;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar39._20_4_;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar39._24_4_;
        bVar3 = SUB81(uVar4 >> 7,0);
        auVar28._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar39._28_4_;
        auVar15 = vphaddd_avx(auVar28._16_16_,auVar20);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        iVar8 = auVar15._0_4_;
      }
      if (iVar7 != iVar8) {
        peVar1 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)local_148,this->model,current_assignment->pattern_vertex);
        local_c0 = peVar1;
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  (&local_198,this->model,current_assignment->target_vertex);
        uVar14 = (ulong)local_38;
        uVar10 = &local_b8;
        if (0x10 < uVar14) {
          uVar10 = local_b8.long_data;
        }
        if (uVar14 == 0) {
          iVar7 = 0;
        }
        else {
          auVar31 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar33 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar34 = auVar33;
            auVar33 = vpbroadcastq_avx512f();
            auVar33 = vporq_avx512f(auVar33,auVar32);
            uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
            auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar10 + uVar11 * 8));
            auVar33._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar39._8_8_;
            auVar33._0_8_ = (ulong)((byte)uVar4 & 1) * auVar39._0_8_;
            auVar33._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar39._16_8_;
            auVar33._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar39._24_8_;
            auVar33._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar39._32_8_;
            auVar33._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar39._40_8_;
            auVar33._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar39._48_8_;
            auVar33._56_8_ = (uVar4 >> 7) * auVar39._56_8_;
            auVar33 = vpopcntq_avx512_vpopcntdq(auVar33);
            auVar23 = vpmovqd_avx512f(auVar33);
            auVar23 = vpaddd_avx2(auVar34._0_32_,auVar23);
            uVar11 = uVar11 + 8;
            auVar33 = ZEXT3264(auVar23);
          } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
          auVar23 = vmovdqa32_avx512vl(auVar23);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar21._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar34._0_4_;
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar21._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar34._4_4_;
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar21._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar34._8_4_;
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar21._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar34._12_4_;
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar29._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar34._16_4_;
          auVar29._0_16_ = auVar21;
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar29._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar34._20_4_;
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar29._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar34._24_4_;
          bVar3 = SUB81(uVar4 >> 7,0);
          auVar29._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar34._28_4_;
          auVar15 = vphaddd_avx(auVar29._16_16_,auVar21);
          auVar15 = vphaddd_avx(auVar15,auVar15);
          auVar15 = vphaddd_avx(auVar15,auVar15);
          iVar7 = auVar15._0_4_;
        }
        uVar14 = (ulong)(d->values).n_words;
        pSVar9 = other;
        if (0x10 < uVar14) {
          pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
        }
        if (uVar14 == 0) {
          iVar8 = 0;
        }
        else {
          auVar31 = vpbroadcastq_avx512f();
          uVar11 = 0;
          auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar33 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar39 = auVar33;
            auVar33 = vpbroadcastq_avx512f();
            auVar33 = vporq_avx512f(auVar33,auVar32);
            uVar4 = vpcmpuq_avx512f(auVar33,auVar31,2);
            auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar9->_data + uVar11 * 8));
            auVar40._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar33._8_8_;
            auVar40._0_8_ = (ulong)((byte)uVar4 & 1) * auVar33._0_8_;
            auVar40._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar33._16_8_;
            auVar40._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar33._24_8_;
            auVar40._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar33._32_8_;
            auVar40._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar33._40_8_;
            auVar40._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar33._48_8_;
            auVar40._56_8_ = (uVar4 >> 7) * auVar33._56_8_;
            auVar33 = vpopcntq_avx512_vpopcntdq(auVar40);
            auVar23 = vpmovqd_avx512f(auVar33);
            auVar23 = vpaddd_avx2(auVar39._0_32_,auVar23);
            uVar11 = uVar11 + 8;
            auVar33 = ZEXT3264(auVar23);
          } while ((uVar14 + 7 & 0x1fffffff8) != uVar11);
          auVar23 = vmovdqa32_avx512vl(auVar23);
          bVar3 = (bool)((byte)uVar4 & 1);
          auVar22._0_4_ = (uint)bVar3 * auVar23._0_4_ | (uint)!bVar3 * auVar39._0_4_;
          bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
          auVar22._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar39._4_4_;
          bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
          auVar22._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar39._8_4_;
          bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
          auVar22._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar39._12_4_;
          bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar39._16_4_;
          auVar30._0_16_ = auVar22;
          bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar39._20_4_;
          bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar39._24_4_;
          bVar3 = SUB81(uVar4 >> 7,0);
          auVar30._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar39._28_4_;
          auVar15 = vphaddd_avx(auVar30._16_16_,auVar22);
          auVar15 = vphaddd_avx(auVar15,auVar15);
          auVar15 = vphaddd_avx(auVar15,auVar15);
          iVar8 = auVar15._0_4_;
        }
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(&local_170,this->model,d->v);
        Proof::propagated(local_c0,(NamedVertex *)local_148,&local_198,g,iVar7 - iVar8,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.second._M_dataplus._M_p != &local_170.second.field_2) {
          operator_delete(local_170.second._M_dataplus._M_p,
                          local_170.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.second._M_dataplus._M_p != &local_198.second.field_2) {
          operator_delete(local_198.second._M_dataplus._M_p,
                          local_198.second.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_148._8_8_ != local_148 + 0x18) {
          operator_delete((void *)local_148._8_8_,local_148._24_8_ + 1);
        }
      }
      SVOBitset::operator=((SVOBitset *)&local_b8,other);
      g = g + 1;
      this_01 = this->model;
    } while (g < this_01->max_graphs);
  }
  if ((bVar5 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)local_148,other);
    iVar7 = HomomorphismModel::pattern_edge_label
                      (this->model,current_assignment->pattern_vertex,d->v);
    uVar14 = (ulong)local_c8;
    pSVar9 = (SVOBitset *)local_148;
    if (0x10 < uVar14) {
      pSVar9 = (SVOBitset *)local_148._0_8_;
    }
    iVar8 = -1;
    if (uVar14 != 0) {
      lVar13 = 0;
LAB_00140e60:
      BVar2 = (pSVar9->_data).short_data[0];
      if (BVar2 == 0) goto code_r0x00140e68;
      iVar8 = 0;
      for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
        iVar8 = iVar8 + 1;
      }
      iVar8 = iVar8 - (int)lVar13;
    }
LAB_00140e81:
    if (iVar8 != -1) {
      do {
        pSVar9 = (SVOBitset *)local_148;
        if (0x10 < local_c8) {
          pSVar9 = (SVOBitset *)local_148._0_8_;
        }
        bVar5 = (byte)iVar8 & 0x3f;
        uVar14 = -2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5;
        iVar12 = iVar8 + 0x3f;
        if (-1 < iVar8) {
          iVar12 = iVar8;
        }
        (pSVar9->_data).short_data[iVar12 >> 6] = (pSVar9->_data).short_data[iVar12 >> 6] & uVar14;
        iVar8 = HomomorphismModel::target_edge_label
                          (this->model,current_assignment->target_vertex,iVar8);
        if (iVar8 != iVar7) {
          pSVar9 = other;
          if (0x10 < (d->values).n_words) {
            pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
          }
          (pSVar9->_data).short_data[iVar12 >> 6] = (pSVar9->_data).short_data[iVar12 >> 6] & uVar14
          ;
        }
        uVar14 = (ulong)local_c8;
        pSVar9 = (SVOBitset *)local_148;
        if (0x10 < uVar14) {
          pSVar9 = (SVOBitset *)local_148._0_8_;
        }
        iVar8 = -1;
        if (uVar14 != 0) {
          lVar13 = 0;
LAB_00140f26:
          BVar2 = (pSVar9->_data).short_data[0];
          if (BVar2 == 0) goto code_r0x00140f2e;
          iVar8 = 0;
          for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          iVar8 = iVar8 - (int)lVar13;
        }
LAB_00140f47:
      } while (iVar8 != -1);
    }
    if ((0x10 < local_c8) && ((SVOBitset *)local_148._0_8_ != (SVOBitset *)0x0)) {
      operator_delete__((void *)local_148._0_8_);
    }
  }
  bVar5 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar5 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)local_148,other);
    iVar7 = HomomorphismModel::pattern_edge_label
                      (this->model,d->v,current_assignment->pattern_vertex);
    uVar14 = (ulong)local_c8;
    pSVar9 = (SVOBitset *)local_148;
    if (0x10 < uVar14) {
      pSVar9 = (SVOBitset *)local_148._0_8_;
    }
    iVar8 = -1;
    if (uVar14 != 0) {
      lVar13 = 0;
LAB_00140fd9:
      BVar2 = (pSVar9->_data).short_data[0];
      if (BVar2 == 0) goto code_r0x00140fe1;
      iVar8 = 0;
      for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
        iVar8 = iVar8 + 1;
      }
      iVar8 = iVar8 - (int)lVar13;
    }
LAB_00140ffa:
    if (iVar8 != -1) {
      do {
        pSVar9 = (SVOBitset *)local_148;
        if (0x10 < local_c8) {
          pSVar9 = (SVOBitset *)local_148._0_8_;
        }
        bVar5 = (byte)iVar8 & 0x3f;
        uVar14 = -2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5;
        iVar12 = iVar8 + 0x3f;
        if (-1 < iVar8) {
          iVar12 = iVar8;
        }
        (pSVar9->_data).short_data[iVar12 >> 6] = (pSVar9->_data).short_data[iVar12 >> 6] & uVar14;
        iVar8 = HomomorphismModel::target_edge_label
                          (this->model,iVar8,current_assignment->target_vertex);
        if (iVar8 != iVar7) {
          pSVar9 = other;
          if (0x10 < (d->values).n_words) {
            pSVar9 = (SVOBitset *)(d->values)._data.short_data[0];
          }
          (pSVar9->_data).short_data[iVar12 >> 6] = (pSVar9->_data).short_data[iVar12 >> 6] & uVar14
          ;
        }
        uVar14 = (ulong)local_c8;
        pSVar9 = (SVOBitset *)local_148;
        if (0x10 < uVar14) {
          pSVar9 = (SVOBitset *)local_148._0_8_;
        }
        iVar8 = -1;
        if (uVar14 != 0) {
          lVar13 = 0;
LAB_0014109a:
          BVar2 = (pSVar9->_data).short_data[0];
          if (BVar2 == 0) goto code_r0x001410a2;
          iVar8 = 0;
          for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          iVar8 = iVar8 - (int)lVar13;
        }
LAB_001410bb:
      } while (iVar8 != -1);
    }
    if ((0x10 < local_c8) && ((SVOBitset *)local_148._0_8_ != (SVOBitset *)0x0)) {
      operator_delete__((void *)local_148._0_8_);
    }
  }
  if ((0x10 < local_38) &&
     ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
      (anon_union_128_2_84168a9f_for__data *)0x0)) {
    operator_delete__(local_b8.long_data);
  }
  return;
code_r0x00140e68:
  lVar13 = lVar13 + -0x40;
  pSVar9 = (SVOBitset *)((long)&pSVar9->_data + 8);
  if (uVar14 * 0x40 + lVar13 == 0) goto LAB_00140e81;
  goto LAB_00140e60;
code_r0x00140f2e:
  lVar13 = lVar13 + -0x40;
  pSVar9 = (SVOBitset *)((long)&pSVar9->_data + 8);
  if (uVar14 * 0x40 + lVar13 == 0) goto LAB_00140f47;
  goto LAB_00140f26;
code_r0x00140fe1:
  lVar13 = lVar13 + -0x40;
  pSVar9 = (SVOBitset *)((long)&pSVar9->_data + 8);
  if (uVar14 * 0x40 + lVar13 == 0) goto LAB_00140ffa;
  goto LAB_00140fd9;
code_r0x001410a2:
  lVar13 = lVar13 + -0x40;
  pSVar9 = (SVOBitset *)((long)&pSVar9->_data + 8);
  if (uVar14 * 0x40 + lVar13 == 0) goto LAB_001410bb;
  goto LAB_0014109a;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}